

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O1

ssize_t tnt_io_recv(tnt_stream_net *s,char *buf,size_t size)

{
  size_t *psVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  int *piVar6;
  ssize_t sVar7;
  size_t sVar8;
  size_t __n;
  long lVar9;
  size_t local_38;
  
  if ((s->rbuf).buf == (char *)0x0) {
    sVar7 = tnt_io_recv_raw(s,buf,size,1);
    return sVar7;
  }
  lVar9 = 0;
  __n = size;
  do {
    sVar2 = (s->rbuf).off;
    uVar3 = (s->rbuf).top;
    if (sVar2 + __n <= uVar3) {
      memcpy(buf + lVar9,(s->rbuf).buf + sVar2,__n);
      psVar1 = &(s->rbuf).off;
      *psVar1 = *psVar1 + __n;
      return size;
    }
    sVar8 = uVar3 - sVar2;
    if (sVar8 != 0) {
      memcpy(buf + lVar9,(s->rbuf).buf + sVar2,sVar8);
      lVar9 = lVar9 + sVar8;
    }
    (s->rbuf).off = 0;
    uVar5 = tnt_io_recv_raw(s,(s->rbuf).buf,(s->rbuf).size,0);
    if ((long)uVar5 < 1) {
      piVar6 = __errno_location();
      s->errno_ = *piVar6;
      s->error = TNT_ESYSTEM;
      local_38 = 0xffffffffffffffff;
      bVar4 = false;
      sVar8 = __n;
    }
    else {
      sVar8 = __n - (uVar3 - sVar2);
      (s->rbuf).top = uVar5;
      bVar4 = true;
      if (sVar8 <= uVar5) {
        memcpy(buf + lVar9,(s->rbuf).buf,sVar8);
        (s->rbuf).off = sVar8;
        bVar4 = false;
        sVar8 = __n;
        local_38 = size;
      }
    }
    __n = sVar8;
  } while (bVar4);
  return local_38;
}

Assistant:

ssize_t
tnt_io_recv(struct tnt_stream_net *s, char *buf, size_t size)
{
	if (s->rbuf.buf == NULL)
		return tnt_io_recv_raw(s, buf, size, 1);
	size_t lv, rv, off = 0, left = size;
	while (1) {
		if ((s->rbuf.off + left) <= s->rbuf.top) {
			memcpy(buf + off, s->rbuf.buf + s->rbuf.off, left);
			s->rbuf.off += left;
			return size;
		}

		lv = s->rbuf.top - s->rbuf.off;
		rv = left - lv;
		if (lv) {
			memcpy(buf + off, s->rbuf.buf + s->rbuf.off, lv);
			off += lv;
		}

		s->rbuf.off = 0;
		ssize_t top = tnt_io_recv_raw(s, s->rbuf.buf, s->rbuf.size, 0);
		if (top <= 0) {
			s->errno_ = errno;
			s->error = TNT_ESYSTEM;
			return -1;
		}

		s->rbuf.top = top;
		if (rv <= s->rbuf.top) {
			memcpy(buf + off, s->rbuf.buf, rv);
			s->rbuf.off = rv;
			return size;
		}
		left -= lv;
	}
	return -1;
}